

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O1

void __thiscall
booster::locale::util::gregorian_calendar::set_timezone(gregorian_calendar *this,string *tz)

{
  int iVar1;
  
  if (tz->_M_string_length == 0) {
    this->is_local_ = true;
    iVar1 = 0;
  }
  else {
    this->is_local_ = false;
    iVar1 = parse_tz(tz);
  }
  this->tzoff_ = iVar1;
  from_time(this,this->time_);
  std::__cxx11::string::_M_assign((string *)&this->time_zone_name_);
  return;
}

Assistant:

virtual void set_timezone(std::string const &tz)
            {
                if(tz.empty()) {
                    is_local_ = true;
                    tzoff_ = 0;
                }
                else {
                    is_local_ = false;
                    tzoff_ = parse_tz(tz);
                }
                from_time(time_);
                time_zone_name_ = tz;
            }